

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

Vec_Int_t * Acb_GetDerefedNodes(Acb_Ntk_t *p)

{
  char *pStr;
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  Vec_Int_t *__s;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  Vec_Int_t *pVVar10;
  
  pVVar10 = (Vec_Int_t *)0x0;
  pVVar4 = Abc_FrameReadSignalNames();
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    p_00 = (Vec_Int_t *)malloc(0x10);
    p_00->nCap = 100;
    p_00->nSize = 0;
    piVar5 = (int *)malloc(400);
    p_00->pArray = piVar5;
    iVar1 = Abc_NamObjNumMax(p->pDesign->pStrs);
    iVar2 = 0x10;
    if (0xe < iVar1 - 1U) {
      iVar2 = iVar1;
    }
    if ((iVar2 == 0) || (__s = (Vec_Int_t *)malloc((long)iVar2 << 2), __s == (Vec_Int_t *)0x0)) {
      __s = (Vec_Int_t *)0x0;
    }
    else {
      memset(__s,0xff,(long)iVar1 << 2);
    }
    uVar6 = (ulong)(p->vObjType).nSize;
    if (1 < (long)uVar6) {
      uVar7 = 1;
      do {
        if (uVar6 <= uVar7) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        if ((p->vObjType).pArray[uVar7] != '\0') {
          uVar8 = (ulong)(p->vObjName).nSize;
          if ((long)uVar8 < 1) {
            __assert_fail("Acb_NtkHasObjNames(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                          ,0x10d,"int Acb_ObjName(Acb_Ntk_t *, int)");
          }
          if (uVar8 <= uVar7) goto LAB_0039924b;
          uVar3 = (p->vObjName).pArray[uVar7];
          if ((ulong)uVar3 != 0) {
            if (((int)uVar3 < 0) || (iVar1 <= (int)uVar3)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            (&__s->nCap)[uVar3] = (int)uVar7;
          }
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < uVar6);
    }
    pVVar10 = p_00;
    if (pVVar4->nSize < 1) {
      if (__s == (Vec_Int_t *)0x0) {
        return p_00;
      }
    }
    else {
      lVar9 = 0;
      do {
        pStr = (char *)pVVar4->pArray[lVar9];
        uVar3 = Abc_NamStrFindOrAdd(p->pDesign->pStrs,pStr,(int *)0x0);
        if (uVar3 == 0) {
          printf("Cannot find name ID for name %s\n",pStr);
          if (__s != (Vec_Int_t *)0x0) goto LAB_0039921c;
LAB_00399221:
          if (p_00->pArray != (int *)0x0) {
            free(p_00->pArray);
          }
          pVVar10 = (Vec_Int_t *)0x0;
          __s = p_00;
          break;
        }
        if (((int)uVar3 < 0) || (iVar1 <= (int)uVar3)) {
LAB_0039924b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if ((&__s->nCap)[uVar3] == -1) {
          printf("Cannot find obj ID for name %s\n",pStr);
LAB_0039921c:
          free(__s);
          goto LAB_00399221;
        }
        Vec_IntPush(p_00,(&__s->nCap)[uVar3]);
        lVar9 = lVar9 + 1;
      } while (lVar9 < pVVar4->nSize);
    }
    free(__s);
  }
  return pVVar10;
}

Assistant:

Vec_Int_t * Acb_GetDerefedNodes( Acb_Ntk_t * p )
{
    Vec_Ptr_t * vNames = Abc_FrameReadSignalNames();
    if ( vNames != NULL )
    {
        Vec_Int_t * vNodes = Vec_IntAlloc( 100 );
        Vec_Int_t * vMap   = Vec_IntStartFull( Abc_NamObjNumMax(p->pDesign->pStrs) );
        int i, iObj; char * pName;
        Acb_NtkForEachObj( p, iObj )
            if ( Acb_ObjName(p, iObj) )
                Vec_IntWriteEntry( vMap, Acb_ObjName(p, iObj), iObj );
        Vec_PtrForEachEntry( char *, vNames, pName, i )
        {
            int NameId = Abc_NamStrFindOrAdd( p->pDesign->pStrs, pName, NULL );
            if ( NameId == 0 )
            {
                printf( "Cannot find name ID for name %s\n", pName );
                Vec_IntFree( vMap );
                Vec_IntFree( vNodes );
                return NULL;
            }
            else if ( Vec_IntEntry(vMap, NameId) == -1 )
            {
                printf( "Cannot find obj ID for name %s\n", pName );
                Vec_IntFree( vMap );
                Vec_IntFree( vNodes );
                return NULL;
            }
            else
                Vec_IntPush( vNodes, Vec_IntEntry(vMap, NameId) );
        }
        Vec_IntFree( vMap );
        return vNodes;
    }
    return NULL;
}